

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O0

void __thiscall
Assimp::BlenderImporter::AddSentinelTexture
          (BlenderImporter *this,aiMaterial *out,Material *mat,MTex *tex,ConversionData *conv_data)

{
  uint uVar1;
  element_type *peVar2;
  char *pcVar3;
  undefined1 local_434 [8];
  aiString name;
  ConversionData *conv_data_local;
  MTex *tex_local;
  Material *mat_local;
  aiMaterial *out_local;
  BlenderImporter *this_local;
  
  name.data._1016_8_ = conv_data;
  aiString::aiString((aiString *)local_434);
  uVar1 = *(uint *)(name.data._1016_8_ + 0xf8);
  *(uint *)(name.data._1016_8_ + 0xf8) = uVar1 + 1;
  peVar2 = std::__shared_ptr_access<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&tex->tex);
  pcVar3 = Blender::GetTextureTypeDisplayString(peVar2->type);
  local_434._0_4_ = snprintf(local_434 + 4,0x400,"Procedural,num=%i,type=%s",(ulong)uVar1,pcVar3);
  uVar1 = *(uint *)(name.data._1016_8_ + 0x100);
  *(uint *)(name.data._1016_8_ + 0x100) = uVar1 + 1;
  aiMaterial::AddProperty(out,(aiString *)local_434,"$tex.file",1,uVar1);
  return;
}

Assistant:

void BlenderImporter::AddSentinelTexture(aiMaterial* out, const Material* mat, const MTex* tex, ConversionData& conv_data)
{
    (void)mat; (void)tex; (void)conv_data;

    aiString name;
    name.length = ai_snprintf(name.data, MAXLEN, "Procedural,num=%i,type=%s",conv_data.sentinel_cnt++,
        GetTextureTypeDisplayString(tex->tex->type)
    );
    out->AddProperty(&name,AI_MATKEY_TEXTURE_DIFFUSE(
        conv_data.next_texture[aiTextureType_DIFFUSE]++)
    );
}